

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Pipeline * __thiscall
capnp::anon_unknown_34::BrokenRequest::sendForPipeline
          (Pipeline *__return_storage_ptr__,BrokenRequest *this)

{
  BrokenPipeline *pBVar1;
  Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t> local_30;
  Own<capnp::PipelineHook,_std::nullptr_t> local_20;
  
  kj::refcounted<capnp::(anonymous_namespace)::BrokenPipeline,kj::Exception&>
            ((kj *)&local_30,&this->exception);
  pBVar1 = local_30.ptr;
  local_30.ptr = (BrokenPipeline *)0x0;
  local_20.disposer = local_30.disposer;
  (__return_storage_ptr__->hook).disposer = local_30.disposer;
  (__return_storage_ptr__->hook).ptr = &pBVar1->super_PipelineHook;
  local_20.ptr = (PipelineHook *)0x0;
  (__return_storage_ptr__->ops).ptr = (PipelineOp *)0x0;
  (__return_storage_ptr__->ops).size_ = 0;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)0x0;
  kj::Own<capnp::PipelineHook,_std::nullptr_t>::dispose(&local_20);
  kj::Own<capnp::(anonymous_namespace)::BrokenPipeline,_std::nullptr_t>::~Own(&local_30);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline sendForPipeline() override {
    return AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception));
  }